

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O0

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  buffer_sequence_iterator_type pcVar1;
  size_t sVar2;
  size_t buffer_size;
  buffer_type buffer;
  buffer_sequence_iterator_type iter;
  size_t abs_n;
  size_t local_28;
  long local_20;
  ptrdiff_t current_buffer_balance;
  ptrdiff_t n_local;
  buffers_iterator<asio::const_buffers_1,_char> *this_local;
  
  current_buffer_balance = n;
  n_local = (ptrdiff_t)this;
  if (n < 1) {
    if (n < 0) {
      iter = (buffer_sequence_iterator_type)-n;
      if ((buffer_sequence_iterator_type)this->position_ < iter) {
        __assert_fail("position_ >= abs_n && \"iterator out of bounds\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/asio/buffers_iterator.hpp"
                      ,0x1bd,
                      "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                     );
      }
LAB_0014871e:
      if ((buffer_sequence_iterator_type)this->current_buffer_position_ < iter) {
        iter = (buffer_sequence_iterator_type)((long)iter - this->current_buffer_position_);
        this->position_ = this->position_ - this->current_buffer_position_;
        if (this->current_ == this->begin_) {
          if (iter == (buffer_sequence_iterator_type)0x0) {
            this->current_buffer_position_ = 0;
            return;
          }
          __assert_fail("abs_n == 0 && \"iterator out of bounds\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/asio/buffers_iterator.hpp"
                        ,0x1cf,
                        "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                       );
        }
        buffer.size_ = (size_t)this->current_;
        do {
          if ((buffer_sequence_iterator_type)buffer.size_ == this->begin_) goto LAB_0014871e;
          buffer_size = *(size_t *)(buffer.size_ - 0x10);
          buffer.data_ = *(void **)(buffer.size_ - 8);
          buffer.size_ = buffer.size_ - 0x10;
          sVar2 = const_buffer::size((const_buffer *)&buffer_size);
        } while (sVar2 == 0);
        this->current_ = (buffer_sequence_iterator_type)buffer.size_;
        (this->current_buffer_).data_ = (void *)buffer_size;
        (this->current_buffer_).size_ = (size_t)buffer.data_;
        this->current_buffer_position_ = sVar2;
        goto LAB_0014871e;
      }
      this->position_ = this->position_ - (long)iter;
      this->current_buffer_position_ = this->current_buffer_position_ - (long)iter;
    }
  }
  else {
    if (this->current_ == this->end_) {
      __assert_fail("current_ != end_ && \"iterator out of bounds\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/asio/buffers_iterator.hpp"
                    ,0x19b,
                    "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                   );
    }
    while( true ) {
      sVar2 = const_buffer::size(&this->current_buffer_);
      local_20 = sVar2 - this->current_buffer_position_;
      if (current_buffer_balance < local_20) break;
      current_buffer_balance = current_buffer_balance - local_20;
      this->position_ = local_20 + this->position_;
      pcVar1 = this->current_;
      this->current_ = pcVar1 + 1;
      if (pcVar1 + 1 == this->end_) {
        if (current_buffer_balance == 0) {
          const_buffer::const_buffer((const_buffer *)&abs_n);
          (this->current_buffer_).data_ = (void *)abs_n;
          (this->current_buffer_).size_ = local_28;
          this->current_buffer_position_ = 0;
          return;
        }
        __assert_fail("n == 0 && \"iterator out of bounds\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/asio/buffers_iterator.hpp"
                      ,0x1b1,
                      "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                     );
      }
      pcVar1 = this->current_;
      (this->current_buffer_).data_ = pcVar1->data_;
      (this->current_buffer_).size_ = pcVar1->size_;
      this->current_buffer_position_ = 0;
    }
    this->position_ = current_buffer_balance + this->position_;
    this->current_buffer_position_ = current_buffer_balance + this->current_buffer_position_;
  }
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }